

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O0

int Mpm_CutComputeDsd6(Mpm_Man_t *p,Mpm_Cut_t *pCut,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,
                      Mpm_Cut_t *pCutC,int fCompl0,int fCompl1,int fComplC,int Type)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  ulong local_138;
  ulong local_128;
  ulong local_118;
  ulong local_108;
  ulong local_f8;
  word local_e8;
  word TruthCp;
  word Truth1p_1;
  int PermC;
  int Perm1_1;
  word Truth0_1;
  int iClassC;
  int iClass1_1;
  int iClass0_1;
  word tC;
  word t1_1;
  word t0_1;
  word Truth1p;
  int Perm1;
  word Truth0;
  int iClass1;
  int iClass0;
  word t1;
  word t0;
  word t;
  int pLeavesNew [6];
  int fCompl;
  int iClass;
  int Config;
  int i;
  int fVerbose;
  int fCompl0_local;
  Mpm_Cut_t *pCutC_local;
  Mpm_Cut_t *pCut1_local;
  Mpm_Cut_t *pCut0_local;
  Mpm_Cut_t *pCut_local;
  Mpm_Man_t *p_local;
  
  pLeavesNew[0] = -1;
  pLeavesNew[1] = -1;
  pLeavesNew[2] = -1;
  pLeavesNew[3] = -1;
  if (pCutC == (Mpm_Cut_t *)0x0) {
    iVar1 = Abc_Lit2Var(*(uint *)&pCut0->field_0x4 & 0x1ffffff);
    iVar2 = Abc_Lit2Var(*(uint *)&pCut1->field_0x4 & 0x1ffffff);
    local_f8 = p->pDsd6[iVar1].uTruth;
    iVar1 = Vec_IntEntry(p->vMap2Perm,p->uPermMask[1]);
    t0_1 = Vec_WrdEntry(p->vPerm6,iVar2 * 0x2d0 + iVar1);
    if (p->uComplMask[1] != 0) {
      for (iClass = 0; iClass < 6; iClass = iClass + 1) {
        if ((p->uComplMask[1] >> ((byte)iClass & 0x1f) & 1) != 0) {
          t0_1 = Abc_Tt6Flip(t0_1,iClass);
        }
      }
    }
    uVar6 = *(uint *)&pCut0->field_0x4;
    uVar3 = Abc_LitIsCompl(*(uint *)&pCut0->field_0x4 & 0x1ffffff);
    if ((fCompl0 ^ uVar6 >> 0x19 & 1) != uVar3) {
      local_f8 = local_f8 ^ 0xffffffffffffffff;
    }
    uVar6 = *(uint *)&pCut1->field_0x4;
    uVar3 = Abc_LitIsCompl(*(uint *)&pCut1->field_0x4 & 0x1ffffff);
    if ((fCompl1 ^ uVar6 >> 0x19 & 1) == uVar3) {
      local_108 = t0_1;
    }
    else {
      local_108 = t0_1 ^ 0xffffffffffffffff;
    }
    if (Type == 1) {
      t0 = local_f8 & local_108;
    }
    else {
      if (Type != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmDsd.c"
                      ,0x3bc,
                      "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
      t0 = local_f8 ^ local_108;
    }
  }
  else {
    iVar1 = Abc_Lit2Var(*(uint *)&pCut0->field_0x4 & 0x1ffffff);
    iVar2 = Abc_Lit2Var(*(uint *)&pCut1->field_0x4 & 0x1ffffff);
    iVar4 = Abc_Lit2Var(*(uint *)&pCutC->field_0x4 & 0x1ffffff);
    local_118 = p->pDsd6[iVar1].uTruth;
    iVar1 = Vec_IntEntry(p->vMap2Perm,p->uPermMask[1]);
    iVar5 = Vec_IntEntry(p->vMap2Perm,p->uPermMask[2]);
    TruthCp = Vec_WrdEntry(p->vPerm6,iVar2 * 0x2d0 + iVar1);
    local_e8 = Vec_WrdEntry(p->vPerm6,iVar4 * 0x2d0 + iVar5);
    if (p->uComplMask[1] != 0) {
      for (iClass = 0; iClass < 6; iClass = iClass + 1) {
        if ((p->uComplMask[1] >> ((byte)iClass & 0x1f) & 1) != 0) {
          TruthCp = Abc_Tt6Flip(TruthCp,iClass);
        }
      }
    }
    if (p->uComplMask[2] != 0) {
      for (iClass = 0; iClass < 6; iClass = iClass + 1) {
        if ((p->uComplMask[2] >> ((byte)iClass & 0x1f) & 1) != 0) {
          local_e8 = Abc_Tt6Flip(local_e8,iClass);
        }
      }
    }
    uVar6 = *(uint *)&pCut0->field_0x4;
    uVar3 = Abc_LitIsCompl(*(uint *)&pCut0->field_0x4 & 0x1ffffff);
    if ((fCompl0 ^ uVar6 >> 0x19 & 1) != uVar3) {
      local_118 = local_118 ^ 0xffffffffffffffff;
    }
    uVar6 = *(uint *)&pCut1->field_0x4;
    uVar3 = Abc_LitIsCompl(*(uint *)&pCut1->field_0x4 & 0x1ffffff);
    if ((fCompl1 ^ uVar6 >> 0x19 & 1) == uVar3) {
      local_128 = TruthCp;
    }
    else {
      local_128 = TruthCp ^ 0xffffffffffffffff;
    }
    uVar6 = *(uint *)&pCutC->field_0x4;
    uVar3 = Abc_LitIsCompl(*(uint *)&pCutC->field_0x4 & 0x1ffffff);
    if ((fComplC ^ uVar6 >> 0x19 & 1) == uVar3) {
      local_138 = local_e8;
    }
    else {
      local_138 = local_e8 ^ 0xffffffffffffffff;
    }
    t0 = local_138 & local_128 | (local_138 ^ 0xffffffffffffffff) & local_118;
  }
  uVar6 = Mpm_CutCheckDsd6(p,t0);
  if (uVar6 == 0xffffffff) {
    p->nNonDsd = p->nNonDsd + 1;
    p_local._4_4_ = 0;
  }
  else {
    pLeavesNew[5] = (int)uVar6 >> 0x11;
    pLeavesNew[4] = (int)uVar6 >> 0x10 & 1;
    if (p->pPars->fMap4Gates != 0) {
      p_00 = Vec_WecEntry(p->vNpnConfigs,pLeavesNew[5]);
      iVar1 = Vec_IntSize(p_00);
      if (iVar1 == 0) {
        p->nNoMatch = p->nNoMatch + 1;
        return 0;
      }
    }
    uVar3 = Abc_Var2Lit(pLeavesNew[5],pLeavesNew[4]);
    *(uint *)&pCut->field_0x4 = *(uint *)&pCut->field_0x4 & 0xfe000000 | uVar3 & 0x1ffffff;
    uVar3 = (int)(uVar6 & 0xffff) >> 6;
    if (0x2cf < uVar3) {
      __assert_fail("(Config >> 6) < 720",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmDsd.c"
                    ,0x405,
                    "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                   );
    }
    for (iClass = 0; iClass < (int)(*(uint *)&pCut->field_0x4 >> 0x1b); iClass = iClass + 1) {
      iVar1 = Abc_LitNotCond(pCut->pLeaves[iClass],
                             (int)(uVar6 & 0xffff) >> ((byte)iClass & 0x1f) & 1);
      pLeavesNew[(long)(int)p->Perm6[(int)uVar3][iClass] + -2] = iVar1;
    }
    *(uint *)&pCut->field_0x4 =
         *(uint *)&pCut->field_0x4 & 0x7ffffff | p->pDsd6[pLeavesNew[5]].nVars << 0x1b;
    for (iClass = 0; iClass < (int)(*(uint *)&pCut->field_0x4 >> 0x1b); iClass = iClass + 1) {
      if (pLeavesNew[(long)iClass + -2] == -1) {
        __assert_fail("pLeavesNew[i] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmDsd.c"
                      ,0x40a,
                      "int Mpm_CutComputeDsd6(Mpm_Man_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, Mpm_Cut_t *, int, int, int, int)"
                     );
      }
    }
    for (iClass = 0; iClass < (int)(*(uint *)&pCut->field_0x4 >> 0x1b); iClass = iClass + 1) {
      pCut->pLeaves[iClass] = pLeavesNew[(long)iClass + -2];
    }
    p->nCountDsd[pLeavesNew[5]] = p->nCountDsd[pLeavesNew[5]] + 1;
    p->nSmallSupp = (uint)(*(uint *)&pCut->field_0x4 >> 0x1b < 2) + p->nSmallSupp;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Mpm_CutComputeDsd6( Mpm_Man_t * p, Mpm_Cut_t * pCut, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCutC, int fCompl0, int fCompl1, int fComplC, int Type )
{
    int fVerbose = 0;
    int i, Config, iClass, fCompl;
    int pLeavesNew[6] = { -1, -1, -1, -1, -1, -1 };
    word t = 0;
    if ( pCutC == NULL )
    {
        word t0, t1;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        if ( Type == 1 )
            t = t0 & t1;
        else if ( Type == 2 )
            t = t0 ^ t1;
        else assert( 0 );

if ( fVerbose )
{
Mpm_ManPrintPerm( p->uPermMask[1] );               printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth0, 6 );   printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&Truth1p, 6 );  printf( "\n" );
Kit_DsdPrintFromTruth( (unsigned *)&t, 6 );        printf( "\n" );
}
    }
    else
    {
        word t0, t1, tC;
        int iClass0  = Abc_Lit2Var(pCut0->iFunc);
        int iClass1  = Abc_Lit2Var(pCut1->iFunc);
        int iClassC  = Abc_Lit2Var(pCutC->iFunc);
        word Truth0  = p->pDsd6[iClass0].uTruth;
        int Perm1    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[1] );
        int PermC    = Vec_IntEntry( p->vMap2Perm, p->uPermMask[2] );
        word Truth1p = Vec_WrdEntry( p->vPerm6, iClass1 * 720 + Perm1 );
        word TruthCp = Vec_WrdEntry( p->vPerm6, iClassC * 720 + PermC );
        if ( p->uComplMask[1] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[1] >> i) & 1 )
                    Truth1p = Abc_Tt6Flip( Truth1p, i );            
        }
        if ( p->uComplMask[2] )
        {
            for ( i = 0; i < 6; i++ )
                if ( (p->uComplMask[2] >> i) & 1 )
                    TruthCp = Abc_Tt6Flip( TruthCp, i );            
        }
        t0 = (fCompl0 ^ pCut0->fCompl ^ Abc_LitIsCompl(pCut0->iFunc)) ? ~Truth0  : Truth0;
        t1 = (fCompl1 ^ pCut1->fCompl ^ Abc_LitIsCompl(pCut1->iFunc)) ? ~Truth1p : Truth1p;
        tC = (fComplC ^ pCutC->fCompl ^ Abc_LitIsCompl(pCutC->iFunc)) ? ~TruthCp : TruthCp;
        t = (tC & t1) | (~tC & t0);
    }

    // find configuration
    Config = Mpm_CutCheckDsd6( p, t );
    if ( Config == -1 )
    {
        p->nNonDsd++;
        return 0;
    }

    // get the class
    iClass = Config >> 17;
    fCompl = (Config >> 16) & 1;
    Config &= 0xFFFF;

    // check if the gate exists
    if ( p->pPars->fMap4Gates )
    {
        if ( Vec_IntSize(Vec_WecEntry(p->vNpnConfigs, iClass)) == 0 )
        {
            p->nNoMatch++;
            return 0;
        }
    }

    // set the function
    pCut->iFunc = Abc_Var2Lit( iClass, fCompl );

if ( fVerbose )
{
Mpm_CutPrint( pCut0 );
Mpm_CutPrint( pCut1 );
Mpm_CutPrint( pCut );
}

    // update cut
    assert( (Config >> 6) < 720 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pLeavesNew[(int)(p->Perm6[Config >> 6][i])] = Abc_LitNotCond( pCut->pLeaves[i], (Config >> i) & 1 );
    pCut->nLeaves = p->pDsd6[iClass].nVars;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        assert( pLeavesNew[i] != -1 );
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        pCut->pLeaves[i] = pLeavesNew[i];
    p->nCountDsd[iClass]++;
    p->nSmallSupp += (int)(pCut->nLeaves < 2);

if ( fVerbose )
{
printf( "Computed " );
Mpm_CutPrint( pCut );
printf( "\n" );
}
    return 1;
}